

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall
fmt::v11::detail::file_print_buffer<_IO_FILE,_void>::file_print_buffer
          (file_print_buffer<_IO_FILE,_void> *this,_IO_FILE *f)

{
  _IO_FILE *p_Var1;
  char *pcVar2;
  char *pcVar3;
  
  (this->super_buffer<char>).size_ = 0;
  (this->super_buffer<char>).capacity_ = 0;
  (this->super_buffer<char>).grow_ = grow;
  (this->file_).super_file_base<_IO_FILE>.file_ = f;
  flockfile((FILE *)f);
  glibc_file<_IO_FILE>::init_buffer(&this->file_);
  p_Var1 = (this->file_).super_file_base<_IO_FILE>.file_;
  pcVar2 = p_Var1->_IO_write_ptr;
  pcVar3 = p_Var1->_IO_buf_end;
  (this->super_buffer<char>).ptr_ = pcVar2;
  (this->super_buffer<char>).capacity_ = (long)pcVar3 - (long)pcVar2;
  return;
}

Assistant:

explicit file_print_buffer(F* f) : buffer(grow, size_t()), file_(f) {
    flockfile(f);
    file_.init_buffer();
    auto buf = file_.get_write_buffer();
    set(buf.data, buf.size);
  }